

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O3

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::set_data
          (section_impl<ELFIO::Elf64_Shdr> *this,char *raw_data,Elf_Word size)

{
  int iVar1;
  char *__dest;
  
  iVar1 = (*(this->super_section)._vptr_section[5])();
  if (iVar1 != 8) {
    if (this->data != (char *)0x0) {
      operator_delete__(this->data);
    }
    __dest = (char *)operator_new__((ulong)size);
    this->data = __dest;
    if (raw_data != (char *)0x0) {
      this->data_size = size;
      if (size == 0) {
        size = 0;
      }
      else {
        memcpy(__dest,raw_data,(ulong)size);
      }
    }
  }
  (*(this->super_section)._vptr_section[0x14])(this,(ulong)size);
  return;
}

Assistant:

void
    set_data( const char* raw_data, Elf_Word size )
    {
        if ( get_type() != SHT_NOBITS ) {
            delete [] data;
            try {
                data = new char[size];
            } catch (const std::bad_alloc&) {
                data      = 0;
                data_size = 0;
                size      = 0;
            }
            if ( 0 != data && 0 != raw_data ) {
                data_size = size;
                std::copy( raw_data, raw_data + size, data );
            }
        }

        set_size( size );
    }